

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::node_is_before_sibling(xml_node_struct *ln,xml_node_struct *rn)

{
  xml_node_struct *rs;
  xml_node_struct *ls;
  xml_node_struct *rn_local;
  xml_node_struct *ln_local;
  bool local_1;
  
  rs = rn;
  ls = ln;
  if (ln->parent == (xml_node_struct *)0x0) {
    local_1 = ln < rn;
  }
  else {
    for (; ls != (xml_node_struct *)0x0 && rs != (xml_node_struct *)0x0; ls = ls->next_sibling) {
      if (ls == rn) {
        return true;
      }
      if (rs == ln) {
        return false;
      }
      rs = rs->next_sibling;
    }
    local_1 = rs == (xml_node_struct *)0x0;
  }
  return local_1;
}

Assistant:

PUGI__FN bool node_is_before_sibling(xml_node_struct* ln, xml_node_struct* rn)
	{
		assert(ln->parent == rn->parent);

		// there is no common ancestor (the shared parent is null), nodes are from different documents
		if (!ln->parent) return ln < rn;

		// determine sibling order
		xml_node_struct* ls = ln;
		xml_node_struct* rs = rn;

		while (ls && rs)
		{
			if (ls == rn) return true;
			if (rs == ln) return false;

			ls = ls->next_sibling;
			rs = rs->next_sibling;
		}

		// if rn sibling chain ended ln must be before rn
		return !rs;
	}